

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

bool CheckWildcards(char *pattern,char *text)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *text_00;
  
  if (text == (char *)0x0 || pattern == (char *)0x0) {
    return true;
  }
LAB_0042cf3a:
  do {
    cVar1 = *pattern;
    pattern = pattern + 1;
    while (cVar1 == '*') {
      iVar3 = tolower((int)*pattern);
      do {
        text_00 = text;
        text = text_00;
        if (*text_00 == '\0') goto LAB_0042cf3a;
        iVar4 = tolower((int)*text_00);
        text = text_00 + 1;
      } while (iVar4 != (char)iVar3);
      bVar2 = CheckWildcards(pattern,text_00);
      if (bVar2) {
        return true;
      }
    }
    if (cVar1 == '\0') {
      return *text == '\0';
    }
    if (cVar1 != '?') {
      iVar3 = tolower((int)cVar1);
      iVar4 = tolower((int)*text);
      if (iVar3 != iVar4) {
        return false;
      }
    }
    text = text + 1;
  } while( true );
}

Assistant:

bool CheckWildcards (const char *pattern, const char *text)
{
	if (pattern == NULL || text == NULL)
		return true;

	while (*pattern)
	{
		if (*pattern == '*')
		{
			char stop = tolower (*++pattern);
			while (*text && tolower(*text) != stop)
			{
				text++;
			}
			if (*text && tolower(*text) == stop)
			{
				if (CheckWildcards (pattern, text++))
				{
					return true;
				}
				pattern--;
			}
		}
		else if (*pattern == '?' || tolower(*pattern) == tolower(*text))
		{
			pattern++;
			text++;
		}
		else
		{
			return false;
		}
	}
	return (*pattern | *text) == 0;
}